

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyTextureDataExtended
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,bool shaderOnly)

{
  pointer *ppuVar1;
  glUseProgramFunc p_Var2;
  undefined *__s;
  undefined4 sample_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  GLenum GVar6;
  deUint32 dVar7;
  ostream *poVar8;
  TestError *this_00;
  uchar *puVar9;
  uchar *puVar10;
  size_type sVar11;
  GLenum *pGVar12;
  GLchar *pGVar13;
  RenderContext *renderCtx;
  ShaderInfo *pSVar14;
  char *pcVar15;
  GLubyte *outDataRegion_2;
  GLubyte *dataRegion_2;
  int local_550;
  GLint z_2;
  GLint y_2;
  GLint x_2;
  ShaderProgram program;
  undefined1 local_450 [8];
  ProgramSources sources;
  string local_378;
  allocator<char> local_351;
  string local_350;
  undefined1 local_330 [8];
  TokenStrings s;
  undefined1 local_1e8 [8];
  string shader;
  GLint sample;
  GLuint verifyTexture;
  GLubyte *out_data_2;
  GLubyte *exp_data_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData_2;
  GLint texSize_2;
  GLint verifyTarget;
  GLubyte *outDataRegion_1;
  GLubyte *dataRegion_1;
  int local_160;
  int pixelSize_1;
  GLint z_1;
  GLint y_1;
  GLint x_1;
  GLint subTarget;
  size_t i;
  GLubyte *out_data_1;
  GLubyte *exp_data_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData_1;
  value_type_conflict1 local_100;
  GLint texSize_1;
  value_type_conflict1 local_f8 [4];
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> subTargets;
  GLubyte *outDataRegion;
  GLubyte *dataRegion;
  int pixelSize;
  GLint z;
  GLint y;
  GLint x;
  GLubyte *out_data;
  GLubyte *exp_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  GLint texSize;
  GLuint GStack_60;
  bool result;
  GLint widthCommitted;
  GLint depth;
  GLint height;
  GLint width;
  TransferFormat local_4c;
  TransferFormat transferFormat;
  bool shaderOnly_local;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  UncommittedRegionsAccessTestCase *this_local;
  
  poVar8 = std::operator<<((ostream *)
                           &(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.field_0x88,
                           "Verify Texture [level: ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,level);
  std::operator<<(poVar8,"] - ");
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x676);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  _height = (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
            mState.format;
  local_4c = glu::getTransferFormat(_height);
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&depth,&widthCommitted,
             (GLint *)&stack0xffffffffffffffa0);
  z = depth / 2;
  if (((z == 0) || (widthCommitted == 0)) ||
     ((int)GStack_60 <
      (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      minDepth)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = true;
    if (((shaderOnly) || (target == 0x8513)) || ((target == 0x9100 || (target == 0x9102)))) {
      if ((shaderOnly) || (target != 0x8513)) {
        if (shaderOnly) {
          if (target == 0x9100) {
            vecExpData_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0xde1;
          }
          else {
            vecExpData_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0x8c1a;
          }
          if (target == 0x8513) {
            GStack_60 = GStack_60 * 6;
          }
          iVar5 = depth * widthCommitted * GStack_60;
          ppuVar1 = &vecOutData_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_2);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,(long)iVar5);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_2,
                     (long)iVar5);
          puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &vecOutData_2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_2)
          ;
          ::deMemset(puVar9,0xff,(long)iVar5);
          gl4cts::Texture::Generate(gl,(GLuint *)(shader.field_2._M_local_buf + 0xc));
          gl4cts::Texture::Bind
                    (gl,shader.field_2._12_4_,
                     vecExpData_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          gl4cts::Texture::Storage
                    (gl,vecExpData_2.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,1,0x8229,depth,
                     widthCommitted,GStack_60);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"Texture::Storage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x6f6);
          for (shader.field_2._8_4_ = 0;
              (int)shader.field_2._8_4_ <
              (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mState.samples; shader.field_2._8_4_ = shader.field_2._8_4_ + 1) {
            ::deMemset(puVar10,0,(long)iVar5);
            gl4cts::Texture::Bind
                      (gl,shader.field_2._12_4_,
                       vecExpData_2.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_);
            gl4cts::Texture::SubImage
                      (gl,vecExpData_2.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,0,0,0,0,depth,
                       widthCommitted,GStack_60,0x1903,0x1401,puVar10);
            GVar6 = (*gl->getError)();
            glu::checkError(GVar6,"Texture::SubImage",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x6ff);
            __s = st2_compute_textureVerify;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1e8,__s,
                       (allocator<char> *)(s.sampleDef.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(s.sampleDef.field_2._M_local_buf + 0xf));
            sample_00 = shader.field_2._8_4_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,"image",&local_351);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_378,"image",(allocator<char> *)&sources.field_0xcf);
            SparseTexture2CommitmentTestCase::createShaderTokens
                      ((TokenStrings *)local_330,&this->super_SparseTexture2CommitmentTestCase,
                       target,format,sample_00,&local_350,&local_378);
            std::__cxx11::string::~string((string *)&local_378);
            std::allocator<char>::~allocator((allocator<char> *)&sources.field_0xcf);
            std::__cxx11::string::~string((string *)&local_350);
            std::allocator<char>::~allocator(&local_351);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<OUTPUT_TYPE>",pGVar13,(string *)local_1e8);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<FORMAT>",pGVar13,(string *)local_1e8);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<INPUT_TYPE>",pGVar13,(string *)local_1e8);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<POINT_TYPE>",pGVar13,(string *)local_1e8);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<POINT_DEF>",pGVar13,(string *)local_1e8);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<RETURN_TYPE>",pGVar13,(string *)local_1e8);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<SAMPLE_DEF>",pGVar13,(string *)local_1e8);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<RESULT_EXPECTED>",pGVar13,(string *)local_1e8);
            pGVar13 = (GLchar *)std::__cxx11::string::c_str();
            replaceToken("<EPSILON>",pGVar13,(string *)local_1e8);
            glu::ProgramSources::ProgramSources((ProgramSources *)local_450);
            glu::ComputeSource::ComputeSource
                      ((ComputeSource *)&program.m_program.m_info.linkTimeUs,(string *)local_1e8);
            glu::ProgramSources::operator<<
                      ((ProgramSources *)local_450,
                       (ShaderSource *)&program.m_program.m_info.linkTimeUs);
            glu::ComputeSource::~ComputeSource
                      ((ComputeSource *)&program.m_program.m_info.linkTimeUs);
            renderCtx = deqp::Context::getRenderContext
                                  ((this->super_SparseTexture2CommitmentTestCase).
                                   super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
            glu::ShaderProgram::ShaderProgram
                      ((ShaderProgram *)&y_2,renderCtx,(ProgramSources *)local_450);
            bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)&y_2);
            if (bVar3) {
              p_Var2 = gl->useProgram;
              dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)&y_2);
              (*p_Var2)(dVar7);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glUseProgram",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                              ,0x718);
              (*gl->bindImageTexture)(0,shader.field_2._12_4_,0,'\0',0,0x88b9,0x8232);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glBindImageTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                              ,0x71f);
              (*gl->bindImageTexture)(1,*texture,level,'\0',0,35000,format);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glBindImageTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                              ,0x726);
              (*gl->uniform1i)(1,0);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glUniform1i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                              ,0x728);
              (*gl->uniform1i)(2,1);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glUniform1i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                              ,0x72a);
              (*gl->dispatchCompute)(depth,widthCommitted,GStack_60);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glDispatchCompute",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                              ,0x72c);
              (*gl->memoryBarrier)(0xffffffff);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glMemoryBarrier",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                              ,0x72e);
              gl4cts::Texture::GetData
                        (gl,0,vecExpData_2.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x1903,0x1401,
                         puVar10);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"Texture::GetData",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                              ,0x731);
              for (z_2 = z; z_2 < depth; z_2 = z_2 + 1) {
                for (local_550 = 0; local_550 < widthCommitted; local_550 = local_550 + 1) {
                  for (dataRegion_2._4_4_ = 0; dataRegion_2._4_4_ < (int)GStack_60;
                      dataRegion_2._4_4_ = dataRegion_2._4_4_ + 1) {
                    if (puVar9[z_2 + local_550 * depth + dataRegion_2._4_4_ * depth * widthCommitted
                              ] !=
                        puVar10[z_2 + local_550 * depth +
                                dataRegion_2._4_4_ * depth * widthCommitted]) {
                      this_local._7_1_ = false;
                    }
                  }
                }
              }
            }
            else {
              poVar8 = std::operator<<((ostream *)
                                       &(this->super_SparseTexture2CommitmentTestCase).
                                        super_SparseTextureCommitmentTestCase.field_0x88,
                                       "Compute shader compilation failed (reading) for target: ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,target);
              poVar8 = std::operator<<(poVar8,", format: ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,format);
              poVar8 = std::operator<<(poVar8,", sample: ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,shader.field_2._8_4_);
              poVar8 = std::operator<<(poVar8,", infoLog: ");
              pSVar14 = glu::ShaderProgram::getShaderInfo
                                  ((ShaderProgram *)&y_2,SHADERTYPE_COMPUTE,0);
              poVar8 = std::operator<<(poVar8,(string *)&pSVar14->infoLog);
              poVar8 = std::operator<<(poVar8,", shaderSource: ");
              pcVar15 = (char *)std::__cxx11::string::c_str();
              poVar8 = std::operator<<(poVar8,pcVar15);
              std::operator<<(poVar8," - ");
              this_local._7_1_ = false;
            }
            glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&y_2);
            glu::ProgramSources::~ProgramSources((ProgramSources *)local_450);
            SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings((TokenStrings *)local_330)
            ;
            std::__cxx11::string::~string((string *)local_1e8);
          }
          gl4cts::Texture::Delete(gl,(GLuint *)(shader.field_2._M_local_buf + 0xc));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_2);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &vecOutData_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      else {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_e8);
        local_f8[3] = 0x8515;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_e8,local_f8 + 3);
        local_f8[2] = 0x8516;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_e8,local_f8 + 2);
        local_f8[1] = 0x8517;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_e8,local_f8 + 1);
        local_f8[0] = 0x8518;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_e8,local_f8);
        texSize_1 = 0x8519;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_e8,&texSize_1);
        local_100 = 0x851a;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_e8,&local_100);
        iVar4 = depth * widthCommitted;
        iVar5 = tcu::TextureFormat::getPixelSize
                          (&(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.mState.format);
        iVar4 = iVar4 * iVar5;
        ppuVar1 = &vecOutData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,(long)iVar4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_1,(long)iVar4)
        ;
        puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &vecOutData_1.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_1);
        ::deMemset(puVar9,0xff,(long)iVar4);
        for (_x_1 = 0;
            sVar11 = std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)local_e8), _x_1 < sVar11;
            _x_1 = _x_1 + 1) {
          pGVar12 = (GLenum *)
                    std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_e8,_x_1);
          GVar6 = *pGVar12;
          poVar8 = std::operator<<((ostream *)
                                   &(this->super_SparseTexture2CommitmentTestCase).
                                    super_SparseTextureCommitmentTestCase.field_0x88,
                                   "Verify Subtarget [subtarget: ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,GVar6);
          std::operator<<(poVar8,"] - ");
          ::deMemset(puVar10,0xff,(long)iVar4);
          gl4cts::Texture::GetData(gl,level,GVar6,local_4c.format,local_4c.dataType,puVar10);
          GVar6 = (*gl->getError)();
          glu::checkError(GVar6,"Texture::GetData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x6c7);
          for (z_1 = z; z_1 < depth; z_1 = z_1 + 1) {
            for (pixelSize_1 = 0; pixelSize_1 < widthCommitted; pixelSize_1 = pixelSize_1 + 1) {
              for (local_160 = 0; local_160 < (int)GStack_60; local_160 = local_160 + 1) {
                iVar5 = tcu::TextureFormat::getPixelSize
                                  (&(this->super_SparseTexture2CommitmentTestCase).
                                    super_SparseTextureCommitmentTestCase.mState.format);
                iVar5 = deMemCmp(puVar9 + (z_1 + pixelSize_1 * depth) * iVar5,
                                 puVar10 + (z_1 + pixelSize_1 * depth) * iVar5,(long)iVar5);
                if (iVar5 != 0) {
                  this_local._7_1_ = false;
                }
              }
            }
          }
          if (this_local._7_1_ == false) break;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data_1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &vecOutData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_e8);
      }
    }
    else {
      iVar4 = depth * widthCommitted * GStack_60;
      iVar5 = tcu::TextureFormat::getPixelSize
                        (&(this->super_SparseTexture2CommitmentTestCase).
                          super_SparseTextureCommitmentTestCase.mState.format);
      iVar4 = iVar4 * iVar5;
      ppuVar1 = &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,(long)iVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data,(long)iVar4);
      puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &vecOutData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      ::deMemset(puVar9,0,(long)iVar4);
      ::deMemset(puVar10,0xff,(long)iVar4);
      gl4cts::Texture::GetData(gl,level,target,local_4c.format,local_4c.dataType,puVar10);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"Texture::GetData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0x699);
      for (; z < depth; z = z + 1) {
        for (pixelSize = 0; pixelSize < widthCommitted; pixelSize = pixelSize + 1) {
          for (dataRegion._4_4_ = 0; dataRegion._4_4_ < (int)GStack_60;
              dataRegion._4_4_ = dataRegion._4_4_ + 1) {
            iVar5 = tcu::TextureFormat::getPixelSize
                              (&(this->super_SparseTexture2CommitmentTestCase).
                                super_SparseTextureCommitmentTestCase.mState.format);
            subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage = (pointer)(puVar10 + (z + pixelSize * depth) * iVar5);
            iVar5 = deMemCmp(puVar9 + (z + pixelSize * depth) * iVar5,
                             subTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)iVar5);
            if (iVar5 != 0) {
              this_local._7_1_ = false;
            }
          }
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyTextureDataExtended(const Functions& gl, GLint target, GLint format,
																 GLuint& texture, GLint level, bool shaderOnly)
{
	mLog << "Verify Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	// Verify texture using API glGetTexImage* (Skip multisample textures as it can not be verified using API)
	if (!shaderOnly && target != GL_TEXTURE_CUBE_MAP && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		// Expected value in this case is 0 because atomic operations result on uncommitted regions are zeros
		deMemset(exp_data, 0, texSize);
		deMemset(out_data, 255, texSize);

		Texture::GetData(gl, level, target, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

		//Verify only committed region
		for (GLint x = widthCommitted; x < width; ++x)
			for (GLint y = 0; y < height; ++y)
				for (GLint z = 0; z < depth; ++z)
				{
					int		 pixelSize	 = mState.format.getPixelSize();
					GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
					GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
					if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
						result = false;
				}
	}
	// Verify texture using API glGetTexImage* (Only cube map as it has to be verified for subtargets)
	else if (!shaderOnly && target == GL_TEXTURE_CUBE_MAP)
	{
		std::vector<GLint> subTargets;

		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Z);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z);

		GLint texSize = width * height * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);

		for (size_t i = 0; i < subTargets.size(); ++i)
		{
			GLint subTarget = subTargets[i];

			mLog << "Verify Subtarget [subtarget: " << subTarget << "] - ";

			deMemset(out_data, 255, texSize);

			Texture::GetData(gl, level, subTarget, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = widthCommitted; x < width; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						int		 pixelSize	 = mState.format.getPixelSize();
						GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
						GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
						if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
							result = false;
					}

			if (!result)
				break;
		}
	}
	// Verify texture using shader imageLoad function
	else if (shaderOnly)
	{
		// Create verifying texture
		GLint verifyTarget;
		if (target == GL_TEXTURE_2D_MULTISAMPLE)
			verifyTarget = GL_TEXTURE_2D;
		else
			verifyTarget = GL_TEXTURE_2D_ARRAY;

		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth;

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		// Expected value in this case is 255 because shader fills output texture with 255 if in texture is filled with zeros
		deMemset(exp_data, 255, texSize);

		GLuint verifyTexture;
		Texture::Generate(gl, verifyTexture);
		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

		for (GLint sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string shader = st2_compute_textureVerify;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
			replaceToken("<FORMAT>", s.format.c_str(), shader);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultDefault.c_str(), shader);
			replaceToken("<EPSILON>", s.epsilon.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0, //unit
									verifyTexture,
									0,		  //level
									GL_FALSE, //layered
									0,		  //layer
									GL_WRITE_ONLY, GL_R8UI);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.bindImageTexture(1, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.uniform1i(2, 1 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint x = widthCommitted; x < width; ++x)
					for (GLint y = 0; y < height; ++y)
						for (GLint z = 0; z < depth; ++z)
						{
							GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
							GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
							if (dataRegion[0] != outDataRegion[0])
								result = false;
						}
			}
			else
			{
				mLog << "Compute shader compilation failed (reading) for target: " << target << ", format: " << format
					 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";

				result = false;
			}
		}

		Texture::Delete(gl, verifyTexture);
	}

	return result;
}